

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O0

void editions_unittest::TestDelimited::SharedDtor(MessageLite *self)

{
  TestDelimited_LengthPrefixed *this;
  TestDelimited *this_00;
  TestDelimited_GroupLike *pTVar1;
  NotGroupLikeScope *this_01;
  MessageImport *this_02;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestDelimited *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestDelimited *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar2 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar2 == (Arena *)0x0) {
    this = (TestDelimited_LengthPrefixed *)local_18[3]._vptr_MessageLite;
    if (this != (TestDelimited_LengthPrefixed *)0x0) {
      TestDelimited_LengthPrefixed::~TestDelimited_LengthPrefixed(this);
      operator_delete(this,0x20);
    }
    this_00 = (TestDelimited *)local_18[3]._internal_metadata_.ptr_;
    if (this_00 != (TestDelimited *)0x0) {
      ~TestDelimited(this_00);
      operator_delete(this_00,0x60);
    }
    pTVar1 = (TestDelimited_GroupLike *)local_18[4]._vptr_MessageLite;
    if (pTVar1 != (TestDelimited_GroupLike *)0x0) {
      TestDelimited_GroupLike::~TestDelimited_GroupLike(pTVar1);
      operator_delete(pTVar1,0x20);
    }
    pTVar1 = (TestDelimited_GroupLike *)local_18[4]._internal_metadata_.ptr_;
    if (pTVar1 != (TestDelimited_GroupLike *)0x0) {
      TestDelimited_GroupLike::~TestDelimited_GroupLike(pTVar1);
      operator_delete(pTVar1,0x20);
    }
    this_01 = (NotGroupLikeScope *)local_18[5]._vptr_MessageLite;
    if (this_01 != (NotGroupLikeScope *)0x0) {
      NotGroupLikeScope::~NotGroupLikeScope(this_01);
      operator_delete(this_01,0x20);
    }
    this_02 = (MessageImport *)local_18[5]._internal_metadata_.ptr_;
    if (this_02 != (MessageImport *)0x0) {
      MessageImport::~MessageImport(this_02);
      operator_delete(this_02,0x20);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
             ,0x6e1,"this_.GetArena() == nullptr");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestDelimited::SharedDtor(MessageLite& self) {
  TestDelimited& this_ = static_cast<TestDelimited&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.lengthprefixed_;
  delete this_._impl_.nested_;
  delete this_._impl_.grouplike_;
  delete this_._impl_.notgrouplike_;
  delete this_._impl_.notgrouplikescope_;
  delete this_._impl_.messageimport_;
  this_._impl_.~Impl_();
}